

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSubdirCommand.cxx
# Opt level: O2

bool cmSubdirCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *args,cmExecutionStatus *status)

{
  cmMakefile *this;
  bool bVar1;
  bool excludeFromAll;
  bool bVar2;
  string *psVar3;
  pointer __lhs;
  string binPath;
  string srcPath;
  cmAlphaNum local_e0;
  string *local_b0;
  pointer local_a8;
  cmAlphaNum local_a0;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  local_a8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (__lhs == local_a8) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"called with incorrect number of arguments",
               (allocator<char> *)&local_a0);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&local_e0);
    bVar2 = false;
  }
  else {
    this = status->Makefile;
    local_b0 = (string *)&status->Error;
    bVar2 = true;
    excludeFromAll = false;
    for (; __lhs != local_a8; __lhs = __lhs + 1) {
      bVar1 = std::operator==(__lhs,"EXCLUDE_FROM_ALL");
      if (bVar1) {
        excludeFromAll = true;
      }
      else {
        bVar1 = std::operator==(__lhs,"PREORDER");
        if (!bVar1) {
          psVar3 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_e0,psVar3,"/");
          std::operator+(&local_50,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_e0,__lhs);
          std::__cxx11::string::~string((string *)&local_e0);
          bVar1 = cmsys::SystemTools::FileIsDirectory(&local_50);
          if (bVar1) {
            psVar3 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_a0,psVar3,"/");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_e0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_a0,__lhs);
            std::__cxx11::string::~string((string *)&local_a0);
            cmMakefile::AddSubDirectory
                      (this,&local_50,(string *)&local_e0,excludeFromAll,false,false);
LAB_00277cda:
            std::__cxx11::string::~string((string *)&local_e0);
          }
          else {
            bVar1 = cmsys::SystemTools::FileIsDirectory(__lhs);
            if (bVar1) {
              psVar3 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_a0,psVar3,"/");
              cmsys::SystemTools::GetFilenameName(&local_70,__lhs);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_e0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_a0,&local_70);
              std::__cxx11::string::~string((string *)&local_70);
              std::__cxx11::string::~string((string *)&local_a0);
              cmMakefile::AddSubDirectory(this,__lhs,(string *)&local_e0,excludeFromAll,false,false)
              ;
              goto LAB_00277cda;
            }
            local_e0.View_._M_len = 0x26;
            local_e0.View_._M_str = "Incorrect SUBDIRS command. Directory: ";
            local_a0.View_._M_str = (__lhs->_M_dataplus)._M_p;
            local_a0.View_._M_len = __lhs->_M_string_length;
            cmStrCat<char[17]>(&local_70,&local_e0,&local_a0,(char (*) [17])0x5b2b8f);
            std::__cxx11::string::_M_assign(local_b0);
            std::__cxx11::string::~string((string *)&local_70);
            bVar2 = false;
          }
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool cmSubdirCommand(std::vector<std::string> const& args,
                     cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }
  bool res = true;
  bool excludeFromAll = false;
  cmMakefile& mf = status.GetMakefile();

  for (std::string const& i : args) {
    if (i == "EXCLUDE_FROM_ALL") {
      excludeFromAll = true;
      continue;
    }
    if (i == "PREORDER") {
      // Ignored
      continue;
    }

    // if they specified a relative path then compute the full
    std::string srcPath = mf.GetCurrentSourceDirectory() + "/" + i;
    if (cmSystemTools::FileIsDirectory(srcPath)) {
      std::string binPath = mf.GetCurrentBinaryDirectory() + "/" + i;
      mf.AddSubDirectory(srcPath, binPath, excludeFromAll, false, false);
    }
    // otherwise it is a full path
    else if (cmSystemTools::FileIsDirectory(i)) {
      // we must compute the binPath from the srcPath, we just take the last
      // element from the source path and use that
      std::string binPath = mf.GetCurrentBinaryDirectory() + "/" +
        cmSystemTools::GetFilenameName(i);
      mf.AddSubDirectory(i, binPath, excludeFromAll, false, false);
    } else {
      status.SetError(cmStrCat("Incorrect SUBDIRS command. Directory: ", i,
                               " does not exist."));
      res = false;
    }
  }
  return res;
}